

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>>,std::error_code,unsigned_long>,std::allocator<void>>
          (executor_function *this,
          binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
          *f,allocator<void> *a)

{
  impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  *f_00;
  allocator<void> *in_RSI;
  undefined8 *in_RDI;
  ptr p;
  impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  *in_stack_ffffffffffffffc0;
  
  f_00 = impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
         ::ptr::allocate(in_RSI);
  impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>>,std::error_code,unsigned_long>,std::allocator<void>>
  ::
  impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>>,std::error_code,unsigned_long>>
            (in_stack_ffffffffffffffc0,
             (binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>
              *)f_00,in_RSI);
  *in_RDI = f_00;
  impl<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)0x40c47d);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }